

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

Define * find_macro_arg(IncludeState *state,Define *defines)

{
  char *__s1;
  long lVar1;
  int iVar2;
  Define *in_RDX;
  char *__s2;
  undefined8 uStack_30;
  char acStack_28 [8];
  
  lVar1 = -((ulong)((int)defines + 1) + 0xf & 0xfffffffffffffff0);
  __s2 = acStack_28 + lVar1;
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x131746;
  memcpy(__s2,state,(ulong)defines & 0xffffffff);
  __s2[(ulong)defines & 0xffffffff] = '\0';
  while( true ) {
    if (in_RDX == (Define *)0x0) {
      return (Define *)0x0;
    }
    if (in_RDX->parameters != (char **)0x0) {
      *(undefined8 *)((long)&uStack_30 + lVar1) = 0x1317a1;
      __assert_fail("def->parameters == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x1f9,"const Define *find_macro_arg(const IncludeState *, const Define *)");
    }
    if (in_RDX->paramcount != 0) {
      *(code **)((long)&uStack_30 + lVar1) = preprocessor_lexer;
      __assert_fail("def->paramcount == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x1fa,"const Define *find_macro_arg(const IncludeState *, const Define *)");
    }
    __s1 = in_RDX->identifier;
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x131768;
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 == 0) break;
    in_RDX = in_RDX->next;
  }
  return in_RDX;
}

Assistant:

static const Define *find_macro_arg(const IncludeState *state,
                                    const Define *defines)
{
    const Define *def = NULL;
    char *sym = (char *) alloca(state->tokenlen + 1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    for (def = defines; def != NULL; def = def->next)
    {
        assert(def->parameters == NULL);  // args can't have args!
        assert(def->paramcount == 0);  // args can't have args!
        if (strcmp(def->identifier, sym) == 0)
            break;
    } // while

    return def;
}